

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_geo_module.c
# Opt level: O0

char * ngx_http_geo_range(ngx_conf_t *cf,ngx_http_geo_conf_ctx_t *ctx,ngx_str_t *value)

{
  int iVar1;
  in_addr_t iVar2;
  uint32_t start_00;
  uint32_t end_00;
  ngx_http_variable_value_t *pnVar3;
  ngx_http_geo_range_t **ppnVar4;
  u_char *last_00;
  u_char *puVar5;
  ngx_uint_t nVar6;
  char *pcVar7;
  ngx_uint_t del;
  ngx_str_t *net;
  in_addr_t end;
  in_addr_t start;
  u_char *last;
  u_char *p;
  ngx_str_t *value_local;
  ngx_http_geo_conf_ctx_t *ctx_local;
  ngx_conf_t *cf_local;
  
  iVar1 = strcmp((char *)value->data,"default");
  if (iVar1 == 0) {
    if ((ctx->high).default_value != (ngx_http_variable_value_t *)0x0) {
      ngx_conf_log_error(5,cf,0,"duplicate default geo range value: \"%V\", old value: \"%v\"",
                         value + 1,(ctx->high).default_value);
    }
    pnVar3 = ngx_http_geo_value(cf,ctx,value + 1);
    (ctx->high).default_value = pnVar3;
    if ((ctx->high).default_value == (ngx_http_variable_value_t *)0x0) {
      cf_local = (ngx_conf_t *)0xffffffffffffffff;
    }
    else {
      cf_local = (ngx_conf_t *)0x0;
    }
  }
  else if (((byte)ctx->field_0xb0 >> 3 & 1) == 0) {
    if ((ctx->high).low == (ngx_http_geo_range_t **)0x0) {
      ppnVar4 = (ngx_http_geo_range_t **)ngx_pcalloc(ctx->pool,0x80000);
      (ctx->high).low = ppnVar4;
      if ((ctx->high).low == (ngx_http_geo_range_t **)0x0) {
        return (char *)0xffffffffffffffff;
      }
    }
    ctx->entries = ctx->entries + 1;
    ctx->field_0xb0 = ctx->field_0xb0 & 0xfd | 2;
    iVar1 = strcmp((char *)value->data,"delete");
    del = (ngx_uint_t)value;
    if (iVar1 == 0) {
      del = (ngx_uint_t)(value + 1);
    }
    last_00 = (u_char *)(*(long *)(del + 8) + *(long *)del);
    puVar5 = ngx_strlchr(*(u_char **)(del + 8),last_00,'-');
    if ((puVar5 != (u_char *)0x0) &&
       (iVar2 = ngx_inet_addr(*(u_char **)(del + 8),(long)puVar5 - *(long *)(del + 8)),
       iVar2 != 0xffffffff)) {
      start_00 = ntohl(iVar2);
      iVar2 = ngx_inet_addr(puVar5 + 1,(long)last_00 - (long)(puVar5 + 1));
      if ((iVar2 != 0xffffffff) && (end_00 = ntohl(iVar2), start_00 <= end_00)) {
        if (iVar1 == 0) {
          nVar6 = ngx_http_geo_delete_range(cf,ctx,start_00,end_00);
          if (nVar6 != 0) {
            ngx_conf_log_error(5,cf,0,"no address range \"%V\" to delete",del);
          }
          return (char *)0x0;
        }
        pnVar3 = ngx_http_geo_value(cf,ctx,value + 1);
        ctx->value = pnVar3;
        if (ctx->value == (ngx_http_variable_value_t *)0x0) {
          return (char *)0xffffffffffffffff;
        }
        ctx->net = (ngx_str_t *)del;
        pcVar7 = ngx_http_geo_add_range(cf,ctx,start_00,end_00);
        return pcVar7;
      }
    }
    ngx_conf_log_error(1,cf,0,"invalid range \"%V\"",del);
    cf_local = (ngx_conf_t *)0xffffffffffffffff;
  }
  else {
    ngx_conf_log_error(1,cf,0,"binary geo range base \"%s\" cannot be mixed with usual entries",
                       (ctx->include_name).data);
    cf_local = (ngx_conf_t *)0xffffffffffffffff;
  }
  return (char *)cf_local;
}

Assistant:

static char *
ngx_http_geo_range(ngx_conf_t *cf, ngx_http_geo_conf_ctx_t *ctx,
    ngx_str_t *value)
{
    u_char      *p, *last;
    in_addr_t    start, end;
    ngx_str_t   *net;
    ngx_uint_t   del;

    if (ngx_strcmp(value[0].data, "default") == 0) {

        if (ctx->high.default_value) {
            ngx_conf_log_error(NGX_LOG_WARN, cf, 0,
                "duplicate default geo range value: \"%V\", old value: \"%v\"",
                &value[1], ctx->high.default_value);
        }

        ctx->high.default_value = ngx_http_geo_value(cf, ctx, &value[1]);
        if (ctx->high.default_value == NULL) {
            return NGX_CONF_ERROR;
        }

        return NGX_CONF_OK;
    }

    if (ctx->binary_include) {
        ngx_conf_log_error(NGX_LOG_EMERG, cf, 0,
            "binary geo range base \"%s\" cannot be mixed with usual entries",
            ctx->include_name.data);
        return NGX_CONF_ERROR;
    }

    if (ctx->high.low == NULL) {
        ctx->high.low = ngx_pcalloc(ctx->pool,
                                    0x10000 * sizeof(ngx_http_geo_range_t *));
        if (ctx->high.low == NULL) {
            return NGX_CONF_ERROR;
        }
    }

    ctx->entries++;
    ctx->outside_entries = 1;

    if (ngx_strcmp(value[0].data, "delete") == 0) {
        net = &value[1];
        del = 1;

    } else {
        net = &value[0];
        del = 0;
    }

    last = net->data + net->len;

    p = ngx_strlchr(net->data, last, '-');

    if (p == NULL) {
        goto invalid;
    }

    start = ngx_inet_addr(net->data, p - net->data);

    if (start == INADDR_NONE) {
        goto invalid;
    }

    start = ntohl(start);

    p++;

    end = ngx_inet_addr(p, last - p);

    if (end == INADDR_NONE) {
        goto invalid;
    }

    end = ntohl(end);

    if (start > end) {
        goto invalid;
    }

    if (del) {
        if (ngx_http_geo_delete_range(cf, ctx, start, end)) {
            ngx_conf_log_error(NGX_LOG_WARN, cf, 0,
                               "no address range \"%V\" to delete", net);
        }

        return NGX_CONF_OK;
    }

    ctx->value = ngx_http_geo_value(cf, ctx, &value[1]);

    if (ctx->value == NULL) {
        return NGX_CONF_ERROR;
    }

    ctx->net = net;

    return ngx_http_geo_add_range(cf, ctx, start, end);

invalid:

    ngx_conf_log_error(NGX_LOG_EMERG, cf, 0, "invalid range \"%V\"", net);

    return NGX_CONF_ERROR;
}